

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniGUI.c
# Opt level: O0

void EPD_Text(uint16_t Xpos,uint16_t Ypos,uint8_t *str,uint8_t Color,uint8_t bkColor)

{
  uint8_t *puVar1;
  uint8_t TempChar;
  uint8_t bkColor_local;
  uint8_t *puStack_18;
  uint8_t Color_local;
  uint8_t *str_local;
  uint16_t Ypos_local;
  uint16_t Xpos_local;
  
  puStack_18 = str;
  str_local._4_2_ = Ypos;
  str_local._6_2_ = Xpos;
  do {
    puVar1 = puStack_18 + 1;
    EPD_PutChar(str_local._6_2_,str_local._4_2_,*puStack_18,Color,bkColor);
    if ((int)(uint)str_local._6_2_ < (int)(gstI80DevInfo.usPanelW - 8)) {
      str_local._6_2_ = str_local._6_2_ + 8;
    }
    else {
      if ((int)(uint)str_local._4_2_ < (int)(gstI80DevInfo.usPanelH - 0x10)) {
        str_local._4_2_ = str_local._4_2_ + 0x10;
      }
      else {
        str_local._4_2_ = 0;
      }
      str_local._6_2_ = 0;
    }
    puStack_18 = puVar1;
  } while (*puVar1 != '\0');
  return;
}

Assistant:

void EPD_Text(uint16_t Xpos,uint16_t Ypos,uint8_t *str,uint8_t Color,uint8_t bkColor)
{
	uint8_t TempChar;
	do
	{
		TempChar = *str++;  
		EPD_PutChar(Xpos, Ypos, TempChar, Color, bkColor);    
		if(Xpos < gstI80DevInfo.usPanelW - 8)
		{
			Xpos += 8;
		} 
		else if (Ypos < gstI80DevInfo.usPanelH - 16)
		{
			Xpos = 0;
			Ypos += 16;
		}   
	else
	{
		Xpos = 0;
		Ypos = 0;
	}    
    }
    while (*str != 0);
}